

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_secp256k1_memczero_test(void)

{
  int iVar1;
  uchar buf2 [6];
  uchar buf1 [6];
  undefined4 local_c;
  undefined2 local_8;
  undefined4 local_6;
  undefined2 local_2;
  
  local_6 = 0x4030201;
  local_2 = 0x605;
  local_c = 0x4030201;
  local_8 = 0x605;
  secp256k1_memczero(&local_6,6,0);
  iVar1 = secp256k1_memcmp_var(&local_6,&local_c,6);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d25,"test condition failed: secp256k1_memcmp_var(buf1, buf2, sizeof(buf1)) == 0");
    abort();
  }
  memset(&local_c,0,6);
  secp256k1_memczero(&local_6,6,1);
  iVar1 = secp256k1_memcmp_var(&local_6,&local_c,6);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d2a,"test condition failed: secp256k1_memcmp_var(buf1, buf2, sizeof(buf1)) == 0");
    abort();
  }
  return;
}

Assistant:

static void run_secp256k1_memczero_test(void) {
    unsigned char buf1[6] = {1, 2, 3, 4, 5, 6};
    unsigned char buf2[sizeof(buf1)];

    /* secp256k1_memczero(..., ..., 0) is a noop. */
    memcpy(buf2, buf1, sizeof(buf1));
    secp256k1_memczero(buf1, sizeof(buf1), 0);
    CHECK(secp256k1_memcmp_var(buf1, buf2, sizeof(buf1)) == 0);

    /* secp256k1_memczero(..., ..., 1) zeros the buffer. */
    memset(buf2, 0, sizeof(buf2));
    secp256k1_memczero(buf1, sizeof(buf1) , 1);
    CHECK(secp256k1_memcmp_var(buf1, buf2, sizeof(buf1)) == 0);
}